

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void __thiscall
iu_VersionTest_x_iutest_x_Check_Test::Body(iu_VersionTest_x_iutest_x_Check_Test *this)

{
  bool bVar1;
  char *message;
  unsigned_long *in_R9;
  AssertionHelper local_210;
  Fixed local_1e0;
  char local_44 [4];
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  unsigned_long v;
  iu_VersionTest_x_iutest_x_Check_Test *this_local;
  
  iutest_ar.m_result = true;
  iutest_ar._33_7_ = 0x11799;
  iutest::detail::AlwaysZero();
  local_44[0] = '\x14';
  local_44[1] = -0x67;
  local_44[2] = '\x17';
  local_44[3] = '\x01';
  iutest::internal::backward::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((AssertionResult *)local_40,(EqHelper<false> *)"0x01179914u","v",local_44,
             (uint *)&iutest_ar.m_result,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/basic_tests.cpp"
               ,0x18,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST(VersionTest, Check)
{
    unsigned long v = (IUTEST_MAJORVER << 24) | (IUTEST_MINORVER << 16) | (IUTEST_MICROVER << 8) | IUTEST_REVISION;
    IUTEST_ASSERT_EQ( IUTEST_VER, v );
}